

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O1

void __thiscall netbase_tests::embedded_test::test_method(embedded_test *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar4;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  string *local_130;
  assertion_result local_128;
  string **local_110;
  string *local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  string local_d8;
  string local_b8;
  CNetAddr addr2;
  CNetAddr addr1;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1.2.3.4","");
  ResolveIP(&addr1,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"::FFFF:0102:0304","");
  ResolveIP(&addr2,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar4 = 0x4e4f9f;
  file.m_end = (iterator)0x93;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(addr2.m_net == NET_IPV4);
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_48._8_8_ = local_1a0;
  local_1a0._0_8_ = "addr2.IsIPv4()";
  local_1a0._8_8_ = "";
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_158 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_160,0x93);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x94;
  file_00.m_begin = (iterator)&local_170;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
             msg_00);
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_b8,&addr1);
  CNetAddr::ToStringAddr_abi_cxx11_(&local_d8,&addr2);
  if (local_b8._M_string_length == local_d8._M_string_length) {
    if (local_b8._M_string_length == 0) {
      local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar1 = bcmp(local_b8._M_dataplus._M_p,local_d8._M_dataplus._M_p,local_b8._M_string_length);
      local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar1 == 0);
    }
  }
  else {
    local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f8 = "";
  local_48._8_8_ = &local_108;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
  local_128._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_130 = &local_d8;
  local_108 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_1a0,1,2,REQUIRE,0xee18be,(size_t)&local_100,0x94,
             (lazy_ostream *)local_58,"addr2.ToStringAddr()",&local_128);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (0x10 < addr2.m_addr._size) {
    free(addr2.m_addr._union.indirect_contents.indirect);
    addr2.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1.m_addr._size) {
    free(addr1.m_addr._union.indirect_contents.indirect);
    addr1.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(embedded_test)
{
    CNetAddr addr1(ResolveIP("1.2.3.4"));
    CNetAddr addr2(ResolveIP("::FFFF:0102:0304"));
    BOOST_CHECK(addr2.IsIPv4());
    BOOST_CHECK_EQUAL(addr1.ToStringAddr(), addr2.ToStringAddr());
}